

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

StyleProp * CreateProps(TidyDocImpl *doc,StyleProp *prop,ctmbstr style)

{
  ctmbstr ptVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  tmbstr ptVar5;
  StyleProp *pSVar6;
  StyleProp *pSVar7;
  tmbstr ptVar8;
  StyleProp *pSVar9;
  char *str;
  char *pcVar10;
  char *pcVar11;
  ctmbstr s2;
  
  ptVar5 = prvTidytmbstrdup(doc->allocator,style);
  if (*ptVar5 != '\0') {
    str = (char *)0x0;
    pcVar11 = ptVar5;
    while( true ) {
      s2 = pcVar11 + -1;
      pcVar10 = pcVar11;
      do {
        pcVar10 = pcVar10 + 1;
        ptVar1 = s2 + 1;
        s2 = s2 + 1;
      } while (*ptVar1 == ' ');
      for (; (cVar3 = pcVar10[-1], pcVar11 = str, cVar3 != '\0' && (pcVar11 = pcVar10, cVar3 != ':')
             ); pcVar10 = pcVar10 + 1) {
      }
      if (cVar3 != ':') break;
      str = pcVar11;
      if (pcVar11 != (char *)0x0) {
        pcVar11 = pcVar11 + -1;
        do {
          str = pcVar11 + 1;
          pcVar2 = pcVar11 + 1;
          pcVar11 = str;
        } while (*pcVar2 == ' ');
      }
      do {
        pcVar2 = pcVar11;
        pcVar11 = pcVar2 + 1;
        cVar3 = *pcVar2;
        if (cVar3 == '\0') break;
      } while (cVar3 != ';');
      pcVar10[-1] = '\0';
      *pcVar2 = '\0';
      if (prop == (StyleProp *)0x0) {
        pSVar9 = (StyleProp *)0x0;
      }
      else {
        pSVar7 = prop;
        pSVar9 = (StyleProp *)0x0;
        do {
          pSVar6 = pSVar7;
          iVar4 = prvTidytmbstrcmp(pSVar6->name,s2);
          pSVar7 = prop;
          if (iVar4 == 0) goto LAB_001524d1;
          if (0 < iVar4) {
            pSVar7 = (StyleProp *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
            ptVar8 = prvTidytmbstrdup(doc->allocator,s2);
            pSVar7->name = ptVar8;
            ptVar8 = prvTidytmbstrdup(doc->allocator,str);
            pSVar7->value = ptVar8;
            pSVar7->next = pSVar6;
            if (pSVar9 == (StyleProp *)0x0) goto LAB_001524d1;
            goto LAB_001524c8;
          }
          pSVar7 = pSVar6->next;
          pSVar9 = pSVar6;
        } while (pSVar6->next != (StyleProp *)0x0);
      }
      pSVar7 = (StyleProp *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
      ptVar8 = prvTidytmbstrdup(doc->allocator,s2);
      pSVar7->name = ptVar8;
      ptVar8 = prvTidytmbstrdup(doc->allocator,str);
      pSVar7->value = ptVar8;
      pSVar7->next = (StyleProp *)0x0;
      if (pSVar9 != (StyleProp *)0x0) {
LAB_001524c8:
        pSVar9->next = pSVar7;
        pSVar7 = prop;
      }
LAB_001524d1:
      prop = pSVar7;
      pcVar10[-1] = ':';
      if ((cVar3 == '\0') || (*pcVar2 = ';', *pcVar11 == '\0')) break;
    }
  }
  (*doc->allocator->vtbl->free)(doc->allocator,ptVar5);
  return prop;
}

Assistant:

static StyleProp* CreateProps( TidyDocImpl* doc, StyleProp* prop, ctmbstr style )
{
    tmbstr name, value = NULL, name_end, value_end, line;
    Bool more;

    line = TY_(tmbstrdup)(doc->allocator, style);
    name = line;

    while (*name)
    {
        while (*name == ' ')
            ++name;

        name_end = name;

        while (*name_end)
        {
            if (*name_end == ':')
            {
                value = name_end + 1;
                break;
            }

            ++name_end;
        }

        if (*name_end != ':')
            break;

        while ( value && *value == ' ')
            ++value;

        value_end = value;
        more = no;

        while (*value_end)
        {
            if (*value_end == ';')
            {
                more = yes;
                break;
            }

            ++value_end;
        }

        *name_end = '\0';
        *value_end = '\0';

        prop = InsertProperty(doc, prop, name, value);
        *name_end = ':';

        if (more)
        {
            *value_end = ';';
            name = value_end + 1;
            continue;
        }

        break;
    }

    TidyDocFree(doc, line);  /* free temporary copy */
    return prop;
}